

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_implement(lys_module *mod,char **features,lys_glob_unres *unres)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (mod->implemented != '\0') {
    __assert_fail("!mod->implemented",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x771,
                  "LY_ERR lys_implement(struct lys_module *, const char **, struct lys_glob_unres *)"
                 );
  }
  plVar2 = ly_ctx_get_module_implemented(mod->ctx,mod->name);
  if (plVar2 == (lys_module *)0x0) {
    LVar1 = lys_set_features(mod->parsed,features);
    if ((LVar1 & ~LY_EEXIST) == LY_SUCCESS) {
      mod->implemented = '\x01';
      mod->to_compile = '\x01';
      LVar1 = ly_set_add(&unres->implementing,mod,'\x01',(uint32_t *)0x0);
      if ((LVar1 == LY_SUCCESS) &&
         (LVar1 = lys_precompile_augments_deviations(mod,unres), LVar1 == LY_SUCCESS)) {
        LVar1 = lys_has_compiled_import_r(mod);
        return LVar1;
      }
    }
  }
  else {
    if (plVar2 == mod) {
      __assert_fail("m != mod",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x776,
                    "LY_ERR lys_implement(struct lys_module *, const char **, struct lys_glob_unres *)"
                   );
    }
    pcVar4 = mod->revision;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "<none>";
    }
    pcVar3 = plVar2->revision;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "<none>";
    }
    LVar1 = LY_EDENIED;
    ly_log(mod->ctx,LY_LLERR,LY_EDENIED,
           "Module \"%s@%s\" is already implemented in revision \"%s\".",mod->name,pcVar4,pcVar3);
  }
  return LVar1;
}

Assistant:

LY_ERR
lys_implement(struct lys_module *mod, const char **features, struct lys_glob_unres *unres)
{
    LY_ERR r;
    struct lys_module *m;

    assert(!mod->implemented);

    /* check collision with other implemented revision */
    m = ly_ctx_get_module_implemented(mod->ctx, mod->name);
    if (m) {
        assert(m != mod);
        LOGERR(mod->ctx, LY_EDENIED, "Module \"%s@%s\" is already implemented in revision \"%s\".",
                mod->name, mod->revision ? mod->revision : "<none>", m->revision ? m->revision : "<none>");
        return LY_EDENIED;
    }

    /* set features */
    r = lys_set_features(mod->parsed, features);
    if (r && (r != LY_EEXIST)) {
        return r;
    }

    /*
     * mark the module implemented, which means
     * 1) to (re)compile it only ::lys_compile() call is needed
     * 2) its compilation will never cause new modules to be implemented (::lys_compile() does not return ::LY_ERECOMPILE)
     *    but there can be some unres items added that do
     */
    mod->implemented = 1;

    /* this module is compiled in this compilation */
    mod->to_compile = 1;

    /* add the module into newly implemented module set */
    LY_CHECK_RET(ly_set_add(&unres->implementing, mod, 1, NULL));

    /* mark target modules with our augments and deviations */
    LY_CHECK_RET(lys_precompile_augments_deviations(mod, unres));

    /* check whether this module may reference any modules compiled previously */
    LY_CHECK_RET(lys_has_compiled_import_r(mod));

    return LY_SUCCESS;
}